

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O1

SpectrumTextureHandle __thiscall
pbrt::SpectrumTextureHandle::Create
          (SpectrumTextureHandle *this,string *name,Transform *renderFromTexture,
          TextureParameterDictionary *parameters,SpectrumType spectrumType,FileLoc *loc,
          Allocator alloc,bool gpu)

{
  int iVar1;
  uintptr_t iptr;
  SpectrumPtexTexture *pSVar2;
  SpectrumImageTexture *pSVar3;
  MarbleTexture *pMVar4;
  FileLoc *loc_00;
  ulong uVar5;
  FileLoc *loc_01;
  Transform *pTVar6;
  char *fmt;
  undefined4 in_register_00000084;
  FileLoc *loc_02;
  long in_FS_OFFSET;
  
  loc_02 = (FileLoc *)CONCAT44(in_register_00000084,spectrumType);
  (this->
  super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
  ).bits = 0;
  loc_00 = (FileLoc *)parameters;
  pTVar6 = (Transform *)name;
  iVar1 = std::__cxx11::string::compare((char *)name);
  if (iVar1 == 0) {
    pSVar2 = (SpectrumPtexTexture *)
             SpectrumConstantTexture::Create(pTVar6,parameters,spectrumType,loc_00,alloc);
    uVar5 = 0x5000000000000;
LAB_0053e1aa:
    (this->
    super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
    ).bits = uVar5 | (ulong)pSVar2;
  }
  else {
    pTVar6 = (Transform *)0x5801b2;
    iVar1 = std::__cxx11::string::compare((char *)name);
    if (iVar1 != 0) {
      pTVar6 = (Transform *)name;
      iVar1 = std::__cxx11::string::compare((char *)name);
      if (iVar1 == 0) {
        pSVar2 = (SpectrumPtexTexture *)
                 SpectrumMixTexture::Create(pTVar6,parameters,spectrumType,loc_00,alloc);
        uVar5 = 0x3000000000000;
      }
      else {
        iVar1 = std::__cxx11::string::compare((char *)name);
        if (iVar1 == 0) {
          pSVar2 = (SpectrumPtexTexture *)
                   SpectrumBilerpTexture::Create
                             (renderFromTexture,parameters,spectrumType,loc,alloc);
          uVar5 = 0x6000000000000;
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)name);
          if (iVar1 == 0) {
            if (gpu) {
              LogFatal(Fatal,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/textures.h"
                       ,0x2df,"GPUSpectrumImageTexture::Create called in non-GPU configuration.");
            }
            pSVar3 = SpectrumImageTexture::Create
                               (renderFromTexture,parameters,spectrumType,loc,alloc);
            (this->
            super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
            ).bits = (ulong)pSVar3 | 0x1000000000000;
            goto LAB_0053e1ba;
          }
          iVar1 = std::__cxx11::string::compare((char *)name);
          if (iVar1 == 0) {
            pSVar2 = (SpectrumPtexTexture *)
                     SpectrumCheckerboardTexture::Create
                               (renderFromTexture,parameters,spectrumType,loc,alloc);
            uVar5 = 0x7000000000000;
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)name);
            if (iVar1 == 0) {
              pSVar2 = (SpectrumPtexTexture *)
                       SpectrumDotsTexture::Create
                                 (renderFromTexture,parameters,spectrumType,loc,alloc);
              uVar5 = 0x9000000000000;
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)name);
              if (iVar1 == 0) {
                pMVar4 = MarbleTexture::Create(renderFromTexture,parameters,loc_01,alloc);
                (this->
                super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
                ).bits = (ulong)pMVar4 | 0x8000000000000;
                goto LAB_0053e1ba;
              }
              pTVar6 = (Transform *)name;
              iVar1 = std::__cxx11::string::compare((char *)name);
              if (iVar1 != 0) {
                fmt = "%s: spectrum texture type unknown.";
                goto LAB_0053e1f9;
              }
              if (gpu) {
                ErrorExit(loc,"ptex texture is not supported on the GPU.");
              }
              pSVar2 = SpectrumPtexTexture::Create(pTVar6,parameters,spectrumType,loc_00,alloc);
              uVar5 = 0xa000000000000;
            }
          }
        }
      }
      goto LAB_0053e1aa;
    }
    SpectrumScaledTexture::Create
              ((SpectrumScaledTexture *)this,pTVar6,parameters,spectrumType,loc_02,alloc);
  }
LAB_0053e1ba:
  if (((this->
       super_TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
       ).bits & 0xffffffffffff) != 0) {
    *(long *)(in_FS_OFFSET + -0x20) = *(long *)(in_FS_OFFSET + -0x20) + 1;
    return (SpectrumTextureHandle)
           (TaggedPointer<pbrt::SpectrumImageTexture,_pbrt::GPUSpectrumImageTexture,_pbrt::SpectrumMixTexture,_pbrt::SpectrumScaledTexture,_pbrt::SpectrumConstantTexture,_pbrt::SpectrumBilerpTexture,_pbrt::SpectrumCheckerboardTexture,_pbrt::MarbleTexture,_pbrt::SpectrumDotsTexture,_pbrt::SpectrumPtexTexture>
            )this;
  }
  fmt = "%s: unable to create texture.";
LAB_0053e1f9:
  ErrorExit<std::__cxx11::string_const&>(loc,fmt,name);
}

Assistant:

SpectrumTextureHandle SpectrumTextureHandle::Create(
    const std::string &name, const Transform &renderFromTexture,
    const TextureParameterDictionary &parameters, SpectrumType spectrumType,
    const FileLoc *loc, Allocator alloc, bool gpu) {
    SpectrumTextureHandle tex;
    if (name == "constant")
        tex = SpectrumConstantTexture::Create(renderFromTexture, parameters, spectrumType,
                                              loc, alloc);
    else if (name == "scale")
        tex = SpectrumScaledTexture::Create(renderFromTexture, parameters, spectrumType,
                                            loc, alloc);
    else if (name == "mix")
        tex = SpectrumMixTexture::Create(renderFromTexture, parameters, spectrumType, loc,
                                         alloc);
    else if (name == "bilerp")
        tex = SpectrumBilerpTexture::Create(renderFromTexture, parameters, spectrumType,
                                            loc, alloc);
    else if (name == "imagemap") {
        if (gpu)
            tex = GPUSpectrumImageTexture::Create(renderFromTexture, parameters,
                                                  spectrumType, loc, alloc);
        else
            tex = SpectrumImageTexture::Create(renderFromTexture, parameters,
                                               spectrumType, loc, alloc);
    } else if (name == "checkerboard")
        tex = SpectrumCheckerboardTexture::Create(renderFromTexture, parameters,
                                                  spectrumType, loc, alloc);
    else if (name == "dots")
        tex = SpectrumDotsTexture::Create(renderFromTexture, parameters, spectrumType,
                                          loc, alloc);
    else if (name == "marble")
        tex = MarbleTexture::Create(renderFromTexture, parameters, loc, alloc);
    else if (name == "ptex") {
        if (gpu)
            ErrorExit(loc, "ptex texture is not supported on the GPU.");
        else
            tex = SpectrumPtexTexture::Create(renderFromTexture, parameters, spectrumType,
                                              loc, alloc);
    } else
        ErrorExit(loc, "%s: spectrum texture type unknown.", name);

    if (!tex)
        ErrorExit(loc, "%s: unable to create texture.", name);

    ++nTextures;

    // FIXME: reenable this once we handle all the same image texture parameters
    // CO    parameters.ReportUnused();
    return tex;
}